

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,
          PropertyIdIndexType propertyIdIndex,RegSlot value2)

{
  bool bVar1;
  undefined1 local_15 [8];
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) && (value < 0x100)) &&
     (((instance < 0x100 && (propertyIdIndex < 0x10000)) && (value2 < 0x100)))) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_15,5);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteElementC2(OpCode op, RegSlot value, RegSlot instance, PropertyIdIndexType propertyIdIndex, RegSlot value2)
    {
        OpLayoutT_ElementC2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.PropertyIdIndex, propertyIdIndex) && SizePolicy::Assign(layout.Value2, value2))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }